

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_1e82c0::TfFinder::~TfFinder(TfFinder *this)

{
  TfFinder *this_local;
  
  (this->super_TokenFilter)._vptr_TokenFilter = (_func_int **)&PTR__TfFinder_0058c588;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->DA);
  std::__cxx11::string::~string((string *)&this->last_name);
  std::__cxx11::string::~string((string *)&this->font_name);
  QPDFObjectHandle::TokenFilter::~TokenFilter(&this->super_TokenFilter);
  return;
}

Assistant:

~TfFinder() override = default;